

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void int_list_diff(int *a,int *b,int *c)

{
  int *piVar1;
  int *piVar2;
  int *local_20;
  int *c_local;
  int *b_local;
  int *a_local;
  
  local_20 = c;
  c_local = b;
  b_local = a;
LAB_00133b10:
  if (-1 < *c_local) {
    while( true ) {
      if (*local_20 < 0) goto LAB_00133b2b;
      while( true ) {
        if (*c_local == *local_20) {
          c_local = c_local + 1;
          local_20 = local_20 + 1;
          goto LAB_00133b10;
        }
        if (*local_20 <= *c_local) break;
        piVar1 = c_local + 1;
        piVar2 = b_local + 1;
        *b_local = *c_local;
        c_local = piVar1;
        b_local = piVar2;
        if (*piVar1 < 0) goto LAB_00133be8;
      }
      if (*c_local <= *local_20) break;
      local_20 = local_20 + 1;
    }
    goto LAB_00133b10;
  }
LAB_00133be8:
  *b_local = -1;
  return;
LAB_00133b2b:
  while (-1 < *c_local) {
    *b_local = *c_local;
    c_local = c_local + 1;
    b_local = b_local + 1;
  }
  goto LAB_00133be8;
}

Assistant:

void int_list_diff(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) {
      while (*b >= 0) *a++ = *b++;
      break;
    }
  Lagainb:
    if (*b == *c) {
      b++;
      c++;
      continue;
    }
    if (*b < *c) {
      *a++ = *b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}